

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preserve_unknown_enum_test.cc
# Opt level: O0

void __thiscall
google::protobuf::PreserveUnknownEnumTest_DynamicProto2HidesUnknownValues_Test::TestBody
          (PreserveUnknownEnumTest_DynamicProto2HidesUnknownValues_Test *this)

{
  bool bVar1;
  Descriptor *type;
  Message *pMVar2;
  MessageLite *pMVar3;
  char *pcVar4;
  type from;
  AssertHelper local_1f0;
  Message local_1e8;
  string_view local_1e0;
  bool local_1ca;
  bool local_1c9;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_2;
  Message local_1b0;
  size_t local_1a8;
  int local_19c;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_1;
  MyMessage message2;
  Message local_120;
  string_view local_118;
  bool local_102;
  bool local_101;
  undefined1 local_100 [8];
  AssertionResult gtest_ar;
  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_> message;
  DynamicMessageFactory factory;
  string serialized;
  undefined1 local_78 [8];
  MyMessagePlusExtra orig_message;
  PreserveUnknownEnumTest_DynamicProto2HidesUnknownValues_Test *this_local;
  
  orig_message.field_0._80_8_ = this;
  proto3_preserve_unknown_enum_unittest::MyMessagePlusExtra::MyMessagePlusExtra
            ((MyMessagePlusExtra *)local_78);
  anon_unknown_15::FillMessage((MyMessagePlusExtra *)local_78);
  std::__cxx11::string::string((string *)&factory.prototypes_mutex_);
  protobuf::MessageLite::SerializeToString
            ((MessageLite *)local_78,(string *)&factory.prototypes_mutex_);
  DynamicMessageFactory::DynamicMessageFactory((DynamicMessageFactory *)&message);
  type = proto2_preserve_unknown_enum_unittest::MyMessage::descriptor();
  pMVar2 = DynamicMessageFactory::GetPrototype((DynamicMessageFactory *)&message,type);
  pMVar2 = Message::New(pMVar2);
  std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>::
  unique_ptr<std::default_delete<google::protobuf::Message>,void>
            ((unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>> *
             )&gtest_ar.message_,pMVar2);
  local_101 = true;
  pMVar3 = &std::
            unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>::
            operator->((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                        *)&gtest_ar.message_)->super_MessageLite;
  local_118 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)&factory.prototypes_mutex_);
  local_102 = protobuf::MessageLite::ParseFromString(pMVar3,local_118);
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_100,"true","message->ParseFromString(serialized)",&local_101,
             &local_102);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&message2.field_0 + 0x48),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/preserve_unknown_enum_test.cc"
               ,0x8c,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&message2.field_0 + 0x48),&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&message2.field_0 + 0x48))
    ;
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  proto2_preserve_unknown_enum_unittest::MyMessage::MyMessage((MyMessage *)&gtest_ar_1.message_);
  from = std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
         ::operator*((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                      *)&gtest_ar.message_);
  Message::CopyFrom((Message *)&gtest_ar_1.message_,from);
  Message::DiscardUnknownFields((Message *)&gtest_ar_1.message_);
  local_19c = 0;
  local_1a8 = proto2_preserve_unknown_enum_unittest::MyMessage::ByteSizeLong
                        ((MyMessage *)&gtest_ar_1.message_);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_198,"0","message2.ByteSizeLong()",&local_19c,&local_1a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/preserve_unknown_enum_test.cc"
               ,0x91,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  std::__cxx11::string::clear();
  pMVar3 = &std::
            unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>::
            operator->((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                        *)&gtest_ar.message_)->super_MessageLite;
  protobuf::MessageLite::SerializeToString(pMVar3,(string *)&factory.prototypes_mutex_);
  local_1c9 = true;
  local_1e0 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)&factory.prototypes_mutex_);
  local_1ca = protobuf::MessageLite::ParseFromString((MessageLite *)local_78,local_1e0);
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_1c8,"true","orig_message.ParseFromString(serialized)",&local_1c9,
             &local_1ca);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/preserve_unknown_enum_test.cc"
               ,0x96,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  anon_unknown_15::CheckMessage((MyMessagePlusExtra *)local_78);
  proto2_preserve_unknown_enum_unittest::MyMessage::~MyMessage((MyMessage *)&gtest_ar_1.message_);
  std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>::
  ~unique_ptr((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
               *)&gtest_ar.message_);
  DynamicMessageFactory::~DynamicMessageFactory((DynamicMessageFactory *)&message);
  std::__cxx11::string::~string((string *)&factory.prototypes_mutex_);
  proto3_preserve_unknown_enum_unittest::MyMessagePlusExtra::~MyMessagePlusExtra
            ((MyMessagePlusExtra *)local_78);
  return;
}

Assistant:

TEST(PreserveUnknownEnumTest, DynamicProto2HidesUnknownValues) {
  proto3_preserve_unknown_enum_unittest::MyMessagePlusExtra orig_message;
  FillMessage(&orig_message);

  std::string serialized;
  orig_message.SerializeToString(&serialized);

  DynamicMessageFactory factory;
  std::unique_ptr<Message> message(
      factory
          .GetPrototype(
              proto2_preserve_unknown_enum_unittest::MyMessage::descriptor())
          ->New());
  EXPECT_EQ(true, message->ParseFromString(serialized));
  // The intermediate message has everything in its "unknown fields".
  proto2_preserve_unknown_enum_unittest::MyMessage message2;
  message2.CopyFrom(*message);
  message2.DiscardUnknownFields();
  EXPECT_EQ(0, message2.ByteSizeLong());

  // But when we pass it to the correct structure, all values are there.
  serialized.clear();
  message->SerializeToString(&serialized);
  EXPECT_EQ(true, orig_message.ParseFromString(serialized));
  CheckMessage(orig_message);
}